

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

bool __thiscall FxBinary::ResolveLR(FxBinary *this,FCompileContext *ctx,bool castnumeric)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  FxExpression *pFVar3;
  PFloat **ppPVar4;
  PType *pPVar5;
  undefined7 in_register_00000011;
  undefined4 extraout_var_00;
  
  pFVar1 = this->left;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx,CONCAT71(in_register_00000011,castnumeric));
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  pFVar1 = this->right;
  if (pFVar1 == (FxExpression *)0x0) {
LAB_0068fd85:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return false;
  }
  iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
  pFVar3 = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
  this->right = pFVar3;
  pFVar1 = this->left;
  if ((pFVar1 == (FxExpression *)0x0) || (pFVar3 == (FxExpression *)0x0)) goto LAB_0068fd85;
  pPVar5 = pFVar1->ValueType;
  if ((pPVar5 == (PType *)TypeBool) && (pFVar3->ValueType == pPVar5)) {
    (this->super_FxExpression).ValueType = (PType *)TypeBool;
    pPVar5 = pFVar1->ValueType;
  }
  iVar2 = (**(code **)(*(long *)&pPVar5->super_DObject + 0x90))();
  if ((iVar2 == 0) &&
     (iVar2 = (*(this->right->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 0)) {
    ppPVar4 = (PFloat **)&TypeSInt32;
  }
  else {
    pFVar1 = this->left;
    pPVar5 = pFVar1->ValueType;
    if ((pPVar5 != (PType *)TypeName) &&
       ((iVar2 = (**(code **)(*(long *)&pPVar5->super_DObject + 0x90))(), iVar2 == 0 ||
        (iVar2 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 1)))) {
      pFVar1 = this->right;
      pPVar5 = pFVar1->ValueType;
      if ((pPVar5 != (PType *)TypeName) &&
         ((iVar2 = (**(code **)(*(long *)&pPVar5->super_DObject + 0x90))(), iVar2 == 0 ||
          (iVar2 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 1)))) {
        ppPVar4 = &TypeFloat64;
        goto LAB_0068fdc1;
      }
    }
    iVar2 = (*(this->left->ValueType->super_DObject)._vptr_DObject[0x12])();
    if ((iVar2 == 3) && (pPVar5 = this->left->ValueType, pPVar5 == this->right->ValueType))
    goto LAB_0068fdc4;
    ppPVar4 = (PFloat **)&TypeVoid;
  }
LAB_0068fdc1:
  pPVar5 = (PType *)*ppPVar4;
LAB_0068fdc4:
  (this->super_FxExpression).ValueType = pPVar5;
  return true;
}

Assistant:

bool FxBinary::ResolveLR(FCompileContext& ctx, bool castnumeric)
{
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return false;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	if (left->ValueType->GetRegType() == REGT_INT && right->ValueType->GetRegType() == REGT_INT)
	{
		ValueType = TypeSInt32;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		ValueType = TypeFloat64;
	}
	else if (left->ValueType->GetRegType() == REGT_POINTER && left->ValueType == right->ValueType)
	{
		ValueType = left->ValueType;
	}
	else
	{
		ValueType = TypeVoid;
	}

	if (castnumeric)
	{
		// later!
	}
	return true;
}